

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  Deleter DVar1;
  Inst *__src;
  Deleter DVar2;
  int iVar3;
  int iVar4;
  PODArray<re2::Prog::Inst> inst;
  
  if (this->failed_ == false) {
    iVar3 = this->ninst_;
    iVar4 = iVar3 + n;
    if (iVar4 <= this->max_ninst_) {
      DVar1.len_ = *(int *)&(this->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                            super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>;
      if (DVar1.len_ < iVar4) {
        DVar2.len_ = 8;
        if ((Deleter)DVar1.len_ != (Deleter)0x0) {
          DVar2.len_ = DVar1.len_;
        }
        do {
          iVar3 = DVar2.len_;
          DVar2.len_ = iVar3 * 2;
        } while (iVar3 < iVar4);
        PODArray<re2::Prog::Inst>::PODArray(&inst,iVar3);
        __src = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        if (__src != (Inst *)0x0) {
          memmove(inst.ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,__src,
                  (long)this->ninst_ << 3);
        }
        memset(inst.ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + this->ninst_,0,
               ((long)iVar3 - (long)this->ninst_) * 8);
        std::__uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>::operator=
                  ((__uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter> *)
                   &this->inst_,
                   (__uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter> *)
                   &inst);
        std::unique_ptr<re2::Prog::Inst[],_re2::PODArray<re2::Prog::Inst>::Deleter>::~unique_ptr
                  (&inst.ptr_);
        iVar3 = this->ninst_;
        iVar4 = n + iVar3;
      }
      this->ninst_ = iVar4;
      return iVar3;
    }
  }
  this->failed_ = true;
  return -1;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || ninst_ + n > max_ninst_) {
    failed_ = true;
    return -1;
  }

  if (ninst_ + n > inst_.size()) {
    int cap = inst_.size();
    if (cap == 0)
      cap = 8;
    while (ninst_ + n > cap)
      cap *= 2;
    PODArray<Prog::Inst> inst(cap);
    if (inst_.data() != NULL)
      memmove(inst.data(), inst_.data(), ninst_*sizeof inst_[0]);
    memset(inst.data() + ninst_, 0, (cap - ninst_)*sizeof inst_[0]);
    inst_ = std::move(inst);
  }
  int id = ninst_;
  ninst_ += n;
  return id;
}